

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void btSoftBody::PSolve_Anchors(btSoftBody *psb,btScalar kst,btScalar ti)

{
  btVector3 *v1;
  long *plVar1;
  float fVar2;
  uint uVar3;
  Anchor *pAVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  btVector3 *rel_pos;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  btVector3 bVar12;
  btVector3 bVar13;
  btVector3 bVar14;
  btVector3 vr;
  btVector3 wa;
  float local_d8;
  float fStack_d4;
  btVector3 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  btScalar local_98;
  btScalar bStack_94;
  btScalar bStack_90;
  btScalar bStack_8c;
  undefined1 local_88 [16];
  float local_78;
  undefined1 local_68 [24];
  btVector3 local_50;
  btVector3 local_40;
  
  local_a8 = kst * (psb->m_cfg).kAHR;
  local_98 = (psb->m_sst).sdt;
  uVar3 = (psb->m_anchors).m_size;
  uVar8 = 0;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar7 = uVar8;
  }
  local_88 = ZEXT416((uint)local_98);
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  bStack_94 = local_98;
  bStack_90 = local_98;
  bStack_8c = local_98;
  local_78 = local_a8;
  for (; uVar7 * 0x68 != uVar8; uVar8 = uVar8 + 0x68) {
    pAVar4 = (psb->m_anchors).m_data;
    plVar1 = (long *)((long)(pAVar4->m_local).m_floats + (uVar8 - 8));
    lVar5 = *plVar1;
    local_40 = btTransform::operator()((btTransform *)(plVar1[3] + 8),(btVector3 *)(plVar1 + 1));
    rel_pos = (btVector3 *)((long)(pAVar4->m_c1).m_floats + uVar8);
    bVar12 = btRigidBody::getVelocityInLocalPoint((btRigidBody *)plVar1[3],rel_pos);
    fVar9 = bVar12.m_floats[2] * (float)local_88._0_4_;
    v1 = (btVector3 *)(lVar5 + 0x10);
    bVar13 = operator-(v1,(btVector3 *)(lVar5 + 0x20));
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_8_ = bVar13.m_floats._0_8_;
    local_68._12_4_ = extraout_XMM0_Dd;
    bVar14 = operator-(&local_40,v1);
    local_d8 = bVar12.m_floats[0];
    fStack_d4 = bVar12.m_floats[1];
    local_50.m_floats[1] =
         bVar14.m_floats[1] * fStack_a4 + (fStack_d4 * bStack_94 - (float)local_68._4_4_);
    local_50.m_floats[0] =
         bVar14.m_floats[0] * local_a8 + (local_d8 * local_98 - (float)local_68._0_4_);
    local_50.m_floats[2] = bVar14.m_floats[2] * local_78 + (fVar9 - bVar13.m_floats[2]);
    local_50.m_floats[3] = 0.0;
    bVar12 = operator*((btMatrix3x3 *)((long)(pAVar4->m_c0).m_el[0].m_floats + uVar8),&local_50);
    fVar9 = *(float *)((long)(pAVar4->m_c0).m_el[0].m_floats + (uVar8 - 4));
    fVar10 = bVar12.m_floats[2] * fVar9;
    fVar2 = *(float *)((long)(&pAVar4->m_c1 + 1) + uVar8);
    fVar11 = fVar9 * bVar12.m_floats[0];
    fVar9 = fVar9 * bVar12.m_floats[1];
    local_b8.m_floats[1] = fVar2 * fVar9;
    local_b8.m_floats[0] = fVar2 * fVar11;
    local_b8.m_floats[2] = fVar2 * fVar10;
    local_b8.m_floats[3] = 0.0;
    btVector3::operator+=(v1,&local_b8);
    uVar6 = CONCAT44(fVar9,fVar11) ^ 0x8000000080000000;
    local_b8.m_floats[2] = -fVar10;
    local_b8.m_floats[0] = (btScalar)(int)uVar6;
    local_b8.m_floats[1] = (btScalar)(int)(uVar6 >> 0x20);
    local_b8.m_floats[3] = 0.0;
    btRigidBody::applyImpulse
              (*(btRigidBody **)((long)(pAVar4->m_c0).m_el[0].m_floats + (uVar8 - 0xc)),&local_b8,
               rel_pos);
  }
  return;
}

Assistant:

void				btSoftBody::PSolve_Anchors(btSoftBody* psb,btScalar kst,btScalar ti)
{
	const btScalar	kAHR=psb->m_cfg.kAHR*kst;
	const btScalar	dt=psb->m_sst.sdt;
	for(int i=0,ni=psb->m_anchors.size();i<ni;++i)
	{
		const Anchor&		a=psb->m_anchors[i];
		const btTransform&	t=a.m_body->getWorldTransform();
		Node&				n=*a.m_node;
		const btVector3		wa=t*a.m_local;
		const btVector3		va=a.m_body->getVelocityInLocalPoint(a.m_c1)*dt;
		const btVector3		vb=n.m_x-n.m_q;
		const btVector3		vr=(va-vb)+(wa-n.m_x)*kAHR;
		const btVector3		impulse=a.m_c0*vr*a.m_influence;
		n.m_x+=impulse*a.m_c2;
		a.m_body->applyImpulse(-impulse,a.m_c1);
	}
}